

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

Statement * SQCompilation::unwrapBody(Statement *stmt)

{
  bool bVar1;
  TreeOp TVar2;
  Block *this;
  ArenaVector<SQCompilation::Statement_*> *this_00;
  Node *in_RDI;
  ArenaVector<SQCompilation::Statement_*> *stmts;
  undefined8 local_8;
  
  if (in_RDI == (Node *)0x0) {
    local_8 = (Node *)0x0;
  }
  else {
    TVar2 = Node::op(in_RDI);
    local_8 = in_RDI;
    if (TVar2 == TO_BLOCK) {
      this = Statement::asBlock((Statement *)in_RDI);
      this_00 = Block::statements(this);
      bVar1 = ArenaVector<SQCompilation::Statement_*>::empty(this_00);
      if (bVar1) {
        local_8 = (Node *)0x0;
      }
      else {
        ArenaVector<SQCompilation::Statement_*>::back(this_00);
        local_8 = &unwrapBody((Statement *)this_00)->super_Node;
      }
    }
  }
  return (Statement *)local_8;
}

Assistant:

static const Statement *unwrapBody(const Statement *stmt) {
  if (!stmt)
    return nullptr;

  if (stmt->op() != TO_BLOCK)
    return stmt;

  auto &stmts = stmt->asBlock()->statements();

  if (stmts.empty())
    return nullptr;

  return unwrapBody(stmts.back());
}